

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

void SHA1_final(uchar *digest,SHA1Context *context)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uchar local_30 [8];
  
  bVar1 = 0;
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    local_30[uVar2] = (uchar)(context->count[uVar2 < 4] >> (~bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  SHA1_update(context,(uchar *)anon_var_dwarf_41ca,1);
  while ((context->count[0] & 0x1f8) != 0x1c0) {
    SHA1_update(context,(uchar *)"",1);
  }
  SHA1_update(context,local_30,8);
  bVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    digest[lVar3] =
         (uchar)(*(uint *)((long)context->state + (ulong)((uint)lVar3 & 0xfffffffc)) >>
                (~bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  context->buffer[0x30] = '\0';
  context->buffer[0x31] = '\0';
  context->buffer[0x32] = '\0';
  context->buffer[0x33] = '\0';
  context->buffer[0x34] = '\0';
  context->buffer[0x35] = '\0';
  context->buffer[0x36] = '\0';
  context->buffer[0x37] = '\0';
  context->buffer[0x38] = '\0';
  context->buffer[0x39] = '\0';
  context->buffer[0x3a] = '\0';
  context->buffer[0x3b] = '\0';
  context->buffer[0x3c] = '\0';
  context->buffer[0x3d] = '\0';
  context->buffer[0x3e] = '\0';
  context->buffer[0x3f] = '\0';
  context->buffer[0x24] = '\0';
  context->buffer[0x25] = '\0';
  context->buffer[0x26] = '\0';
  context->buffer[0x27] = '\0';
  context->buffer[0x28] = '\0';
  context->buffer[0x29] = '\0';
  context->buffer[0x2a] = '\0';
  context->buffer[0x2b] = '\0';
  context->buffer[0x2c] = '\0';
  context->buffer[0x2d] = '\0';
  context->buffer[0x2e] = '\0';
  context->buffer[0x2f] = '\0';
  context->buffer[0x30] = '\0';
  context->buffer[0x31] = '\0';
  context->buffer[0x32] = '\0';
  context->buffer[0x33] = '\0';
  context->buffer[0x14] = '\0';
  context->buffer[0x15] = '\0';
  context->buffer[0x16] = '\0';
  context->buffer[0x17] = '\0';
  context->buffer[0x18] = '\0';
  context->buffer[0x19] = '\0';
  context->buffer[0x1a] = '\0';
  context->buffer[0x1b] = '\0';
  context->buffer[0x1c] = '\0';
  context->buffer[0x1d] = '\0';
  context->buffer[0x1e] = '\0';
  context->buffer[0x1f] = '\0';
  context->buffer[0x20] = '\0';
  context->buffer[0x21] = '\0';
  context->buffer[0x22] = '\0';
  context->buffer[0x23] = '\0';
  context->buffer[4] = '\0';
  context->buffer[5] = '\0';
  context->buffer[6] = '\0';
  context->buffer[7] = '\0';
  context->buffer[8] = '\0';
  context->buffer[9] = '\0';
  context->buffer[10] = '\0';
  context->buffer[0xb] = '\0';
  context->buffer[0xc] = '\0';
  context->buffer[0xd] = '\0';
  context->buffer[0xe] = '\0';
  context->buffer[0xf] = '\0';
  context->buffer[0x10] = '\0';
  context->buffer[0x11] = '\0';
  context->buffer[0x12] = '\0';
  context->buffer[0x13] = '\0';
  *(undefined8 *)(context->state + 4) = 0;
  *(undefined8 *)(context->count + 1) = 0;
  context->state[0] = 0;
  context->state[1] = 0;
  context->state[2] = 0;
  context->state[3] = 0;
  SHA1_transform(context->state,context->buffer);
  return;
}

Assistant:

static void SHA1_final(unsigned char digest[20], SHA1Context *context) {
    uint32_t i;
    unsigned char finalcount[8];

    for (i = 0; i < 8; i++) {
        finalcount[i] = (unsigned char)
                        ((context->count[(i >= 4 ? 0 : 1)] >>
                          ((3 - (i & 3)) * 8)) & 255);
    }

    SHA1_update(context, (unsigned char *) "\200", 1);

    while ((context->count[0] & 504) != 448) {
        SHA1_update(context, (unsigned char *) "\0", 1);
    }

    SHA1_update(context, finalcount, 8);

    for (i = 0; i < 20; i++) {
        digest[i] = (unsigned char)
                    ((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
    }

    memset(context->buffer, 0, 64);
    memset(context->state, 0, 20);
    memset(context->count, 0, 8);
    memset(&finalcount, 0, 8);

    SHA1_transform(context->state, context->buffer);
}